

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O1

int ERKStepSetTable(void *arkode_mem,ARKodeButcherTable B)

{
  int iVar1;
  ARKodeButcherTable B_00;
  int line;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem local_40;
  ARKodeMem local_38;
  long local_30;
  long local_28;
  
  iVar1 = erkStep_AccessARKODEStepMem(arkode_mem,"ERKStepSetTable",&local_38,&local_40);
  if (iVar1 == 0) {
    if (B == (ARKodeButcherTable)0x0) {
      line = 0x3a;
    }
    else {
      local_40->stages = 0;
      local_40->q = 0;
      local_40->p = 0;
      ARKodeButcherTable_Space(local_40->B,&local_30,&local_28);
      ARKodeButcherTable_Free(local_40->B);
      local_40->B = (ARKodeButcherTable)0x0;
      local_38->liw = local_38->liw - local_30;
      local_38->lrw = local_38->lrw - local_28;
      local_40->stages = B->stages;
      iVar1 = B->p;
      local_40->q = B->q;
      local_40->p = iVar1;
      B_00 = ARKodeButcherTable_Copy(B);
      local_40->B = B_00;
      if (B_00 != (ARKodeButcherTable)0x0) {
        ARKodeButcherTable_Space(B_00,&local_30,&local_28);
        local_38->liw = local_38->liw + local_30;
        local_38->lrw = local_38->lrw + local_28;
        return 0;
      }
      line = 0x53;
    }
    iVar1 = -0x15;
    arkProcessError(local_38,-0x15,line,"ERKStepSetTable",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  return iVar1;
}

Assistant:

int ERKStepSetTable(void* arkode_mem, ARKodeButcherTable B)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeMem and ARKodeERKStepMem structures */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check for legal inputs */
  if (B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* set the relevant parameters */
  step_mem->stages = B->stages;
  step_mem->q      = B->q;
  step_mem->p      = B->p;

  /* copy the table into step memory */
  step_mem->B = ARKodeButcherTable_Copy(B);
  if (step_mem->B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return (ARK_SUCCESS);
}